

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

int __thiscall Fl_Type::user_defined(Fl_Type *this,char *cbname)

{
  Fl_Type *pFVar1;
  char *__s1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  Fl_Type **ppFVar3;
  
  ppFVar3 = &first;
  while (pFVar1 = *ppFVar3, pFVar1 != (Fl_Type *)0x0) {
    iVar2 = (*pFVar1->_vptr_Fl_Type[5])(pFVar1);
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Function");
    if ((iVar2 == 0) && (__s1 = pFVar1->name_, __s1 != (char *)0x0)) {
      __n = strlen(cbname);
      iVar2 = strncmp(__s1,cbname,__n);
      if ((iVar2 == 0) && (__s1[__n] == '(')) break;
    }
    ppFVar3 = &pFVar1->next;
  }
  return (uint)(pFVar1 != (Fl_Type *)0x0);
}

Assistant:

int Fl_Type::user_defined(const char* cbname) const {
  for (Fl_Type* p = Fl_Type::first; p ; p = p->next)
    if (strcmp(p->type_name(), "Function") == 0 && p->name() != 0)
      if (strncmp(p->name(), cbname, strlen(cbname)) == 0)
        if (p->name()[strlen(cbname)] == '(')
          return 1;
  return 0;
}